

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.y
# Opt level: O0

void __thiscall DocumentStorage::~DocumentStorage(DocumentStorage *this)

{
  Document *this_00;
  size_type sVar1;
  reference ppDVar2;
  int local_14;
  int4 i;
  DocumentStorage *this_local;
  
  for (local_14 = 0;
      sVar1 = std::vector<Document_*,_std::allocator<Document_*>_>::size(&this->doclist),
      (ulong)(long)local_14 < sVar1; local_14 = local_14 + 1) {
    ppDVar2 = std::vector<Document_*,_std::allocator<Document_*>_>::operator[]
                        (&this->doclist,(long)local_14);
    if (*ppDVar2 != (value_type)0x0) {
      ppDVar2 = std::vector<Document_*,_std::allocator<Document_*>_>::operator[]
                          (&this->doclist,(long)local_14);
      this_00 = *ppDVar2;
      if (this_00 != (Document *)0x0) {
        Document::~Document(this_00);
        operator_delete(this_00);
      }
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>_>
  ::~map(&this->tagmap);
  std::vector<Document_*,_std::allocator<Document_*>_>::~vector(&this->doclist);
  return;
}

Assistant:

DocumentStorage::~DocumentStorage(void)

{
  for(int4 i=0;i<doclist.size();++i) {
    if (doclist[i] != (Document *)0)
      delete doclist[i];
  }
}